

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fGeometryShaderTests.cpp
# Opt level: O2

void __thiscall
deqp::gles31::Functional::anon_unknown_1::BuiltinVariableShader::shadeFragments
          (BuiltinVariableShader *this,FragmentPacket *packets,int numPackets,
          FragmentShadingContext *context)

{
  uint uVar1;
  GenericVec4 *pGVar2;
  int iVar3;
  ulong uVar4;
  ulong uVar5;
  int fragNdx;
  int iVar6;
  ulong uVar7;
  long lVar8;
  Vec4 color;
  Vec4 colors [4];
  Vector<float,_4> local_78;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  
  local_48.m_data[0] = 1.0;
  local_48.m_data[1] = 0.0;
  local_48.m_data[2] = 0.0;
  local_48.m_data[3] = 1.0;
  local_58.m_data[0] = 0.0;
  local_58.m_data[1] = 1.0;
  local_58.m_data[2] = 0.0;
  local_58.m_data[3] = 1.0;
  local_68.m_data[0] = 0.0;
  local_68.m_data[1] = 0.0;
  local_68.m_data[2] = 1.0;
  local_68.m_data[3] = 1.0;
  local_78.m_data[0] = 1.0;
  local_78.m_data[1] = 1.0;
  local_78.m_data[2] = 0.0;
  local_78.m_data[3] = 1.0;
  tcu::Vector<float,_4>::Vector(colors,&local_78);
  tcu::Vector<float,_4>::Vector(colors + 1,&local_48);
  tcu::Vector<float,_4>::Vector(colors + 2,&local_58);
  tcu::Vector<float,_4>::Vector(colors + 3,&local_68);
  uVar1 = *(uint *)&(this->super_ShaderProgram).field_0x154;
  if (uVar1 < 2) {
    uVar4 = 0;
    uVar7 = (ulong)(uint)numPackets;
    if (numPackets < 1) {
      uVar7 = uVar4;
    }
    for (uVar5 = 0; uVar5 != uVar7; uVar5 = uVar5 + 1) {
      for (iVar6 = 0; iVar6 != 4; iVar6 = iVar6 + 1) {
        rr::readVarying<float>((rr *)&color,packets + uVar5,context,0,iVar6);
        iVar3 = ((int)uVar4 + iVar6) * context->numFragmentOutputs;
        pGVar2 = context->outputArray;
        pGVar2[iVar3].v.fData[0] = color.m_data[0];
        pGVar2[iVar3].v.fData[1] = color.m_data[1];
        pGVar2[iVar3].v.fData[2] = color.m_data[2];
        pGVar2[iVar3].v.fData[3] = color.m_data[3];
      }
      uVar4 = (ulong)((int)uVar4 + 4);
    }
  }
  else if (uVar1 == 2) {
    tcu::Vector<float,_4>::Vector(&color,colors + context->primitiveID % 4);
    pGVar2 = context->outputArray;
    iVar6 = context->numFragmentOutputs;
    uVar4 = 0;
    uVar7 = (ulong)(uint)numPackets;
    if (numPackets < 1) {
      uVar7 = uVar4;
    }
    for (; uVar4 != uVar7; uVar4 = uVar4 + 1) {
      for (lVar8 = 0; lVar8 != 4; lVar8 = lVar8 + 1) {
        iVar3 = ((uint)lVar8 | (int)uVar4 * 4) * iVar6;
        pGVar2[iVar3].v.fData[0] = color.m_data[0];
        pGVar2[iVar3].v.fData[1] = color.m_data[1];
        pGVar2[iVar3].v.fData[2] = color.m_data[2];
        pGVar2[iVar3].v.fData[3] = color.m_data[3];
      }
    }
  }
  return;
}

Assistant:

void BuiltinVariableShader::shadeFragments (rr::FragmentPacket* packets, const int numPackets, const rr::FragmentShadingContext& context) const
{
	const tcu::Vec4 red			= tcu::Vec4(1.0f, 0.0f, 0.0f, 1.0f);
	const tcu::Vec4 green		= tcu::Vec4(0.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 blue		= tcu::Vec4(0.0f, 0.0f, 1.0f, 1.0f);
	const tcu::Vec4 yellow		= tcu::Vec4(1.0f, 1.0f, 0.0f, 1.0f);
	const tcu::Vec4 colors[4]	= { yellow, red, green, blue };

	if (m_test == TEST_POINT_SIZE || m_test == TEST_PRIMITIVE_ID_IN)
	{
		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, rr::readVarying<float>(packets[packetNdx], context, 0, fragNdx));
	}
	else if (m_test == TEST_PRIMITIVE_ID)
	{
		const tcu::Vec4 color = colors[context.primitiveID % 4];

		for (int packetNdx = 0; packetNdx < numPackets; ++packetNdx)
		for (int fragNdx = 0; fragNdx < 4; ++fragNdx)
			rr::writeFragmentOutput(context, packetNdx, fragNdx, 0, color);
	}
	else
		DE_ASSERT(DE_FALSE);
}